

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
initShaderSources(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  ostream *poVar1;
  stringstream fragShader;
  stringstream vertShader;
  string local_340 [32];
  string local_320 [16];
  ostream local_310 [376];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"#version 430\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 in_position;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in vec4 in_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
  poVar1 = std::operator<<(poVar1,"out gl_PerVertex {\n");
  poVar1 = std::operator<<(poVar1,"    vec4  gl_Position;\n");
  poVar1 = std::operator<<(poVar1,"    float gl_PointSize;\n");
  poVar1 = std::operator<<(poVar1,"};\n");
  poVar1 = std::operator<<(poVar1,"void main() {\n");
  poVar1 = std::operator<<(poVar1,"    gl_PointSize = 1.0;\n");
  poVar1 = std::operator<<(poVar1,"    gl_Position  = in_position;\n");
  poVar1 = std::operator<<(poVar1,"    out_color    = in_color;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,local_320);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::stringstream::stringstream((stringstream *)local_320);
  poVar1 = std::operator<<(local_310,"#version 430\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 in_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
  poVar1 = std::operator<<(poVar1,"void main()\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    out_color = in_color;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_320);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void DrawTestCase<T>::initShaderSources (void)
{
	std::stringstream vertShader;
	vertShader	<< "#version 430\n"
				<< "layout(location = 0) in vec4 in_position;\n"
				<< "layout(location = 1) in vec4 in_color;\n"
				<< "layout(location = 0) out vec4 out_color;\n"

				<< "out gl_PerVertex {\n"
				<< "    vec4  gl_Position;\n"
				<< "    float gl_PointSize;\n"
				<< "};\n"
				<< "void main() {\n"
				<< "    gl_PointSize = 1.0;\n"
				<< "    gl_Position  = in_position;\n"
				<< "    out_color    = in_color;\n"
				<< "}\n";

	m_vertShaderSource = vertShader.str();

	std::stringstream fragShader;
	fragShader	<< "#version 430\n"
				<< "layout(location = 0) in vec4 in_color;\n"
				<< "layout(location = 0) out vec4 out_color;\n"
				<< "void main()\n"
				<< "{\n"
				<< "    out_color = in_color;\n"
				<< "}\n";

	m_fragShaderSource = fragShader.str();
}